

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

UnaryFunctionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_unary(NeuralNetworkLayer *this)

{
  ulong uVar1;
  UnaryFunctionLayerParams *pUVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0xdc) {
    clear_layer(this);
    this->_oneof_case_[0] = 0xdc;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pUVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::UnaryFunctionLayerParams>(arena);
    (this->layer_).unary_ = pUVar2;
  }
  return (UnaryFunctionLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UnaryFunctionLayerParams* NeuralNetworkLayer::_internal_mutable_unary() {
  if (!_internal_has_unary()) {
    clear_layer();
    set_has_unary();
    layer_.unary_ = CreateMaybeMessage< ::CoreML::Specification::UnaryFunctionLayerParams >(GetArenaForAllocation());
  }
  return layer_.unary_;
}